

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::RegisterTests
          (ParameterizedTestSuiteInfo<P256NistzSelectImplTest> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *__s;
  pointer pcVar3;
  element_type *peVar4;
  _Alloc_hider value_param;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  pointer pIVar9;
  long *plVar10;
  long *plVar11;
  ostream *poVar12;
  size_t sVar13;
  const_iterator cVar14;
  long *plVar15;
  char *pcVar16;
  undefined4 extraout_var;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  long lVar17;
  string param_name;
  string test_suite_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string test_name;
  ParamGenerator<P256NistzSelectImpl> generator;
  pointer local_1a0;
  string local_198;
  string local_178;
  undefined1 *local_158;
  long local_150;
  undefined1 local_148;
  undefined7 uStack_147;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  P256NistzSelectImpl *local_108;
  char *local_100;
  undefined8 local_f8;
  char local_f0;
  undefined7 uStack_ef;
  string local_e0;
  long *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  CodeLocation local_b0;
  pointer local_88;
  pointer local_80;
  pointer local_78;
  ParameterizedTestSuiteInfo<P256NistzSelectImplTest> *local_70;
  ParamNameGeneratorFunc *local_68;
  long local_60;
  CodeLocation local_58;
  
  local_158 = &local_148;
  local_150 = 0;
  local_148 = 0;
  local_100 = &local_f0;
  local_f8 = 0;
  local_f0 = '\0';
  local_1a0 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1a0 != local_88) {
    bVar6 = false;
    local_70 = this;
    do {
      pIVar9 = (this->instantiations_).
               super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::InstantiationInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_80 = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar9 != local_80) {
        do {
          (*pIVar9->generator)(&local_c0);
          sVar2 = (pIVar9->name)._M_string_length;
          local_68 = pIVar9->name_func;
          __s = pIVar9->file;
          iVar8 = pIVar9->line;
          local_78 = pIVar9;
          if (sVar2 == 0) {
            local_150 = 0;
            *local_158 = 0;
          }
          else {
            local_138._M_impl._0_8_ = &local_138._M_impl.super__Rb_tree_header._M_header._M_parent;
            pcVar3 = (pIVar9->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>((string *)&local_138,pcVar3,pcVar3 + sVar2);
            std::__cxx11::string::append((char *)&local_138);
            std::__cxx11::string::operator=((string *)&local_158,(string *)&local_138);
            if ((_Base_ptr *)local_138._M_impl._0_8_ !=
                &local_138._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_138._M_impl._0_8_,
                              (ulong)((long)&(local_138._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_158,(ulong)(this->test_suite_name_)._M_dataplus._M_p);
          local_138._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_138._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_138._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_138._M_impl.super__Rb_tree_header._M_header;
          local_138._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_138._M_impl.super__Rb_tree_header._M_header._M_right =
               local_138._M_impl.super__Rb_tree_header._M_header._M_left;
          plVar10 = (long *)(**(code **)(*local_c0 + 0x10))();
          plVar11 = (long *)(**(code **)(*local_c0 + 0x18))();
          if (plVar10 != plVar11) {
            lVar17 = 0;
            while( true ) {
              cVar5 = (**(code **)(*plVar10 + 0x30))(plVar10,plVar11);
              if (cVar5 != '\0') break;
              local_108 = (P256NistzSelectImpl *)(**(code **)(*plVar10 + 0x28))(plVar10);
              local_f8 = 0;
              *local_100 = '\0';
              local_198.field_2._M_allocated_capacity = (size_type)local_108->select_w7;
              local_198._M_dataplus._M_p = local_108->name;
              local_198._M_string_length = (size_type)local_108->select_w5;
              local_198.field_2._8_8_ = lVar17;
              (*local_68)(&local_178,(TestParamInfo<P256NistzSelectImpl> *)&local_198);
              bVar6 = IsValidParamName(&local_178);
              bVar6 = IsTrue(bVar6);
              if (!bVar6) {
                GTestLog::GTestLog((GTestLog *)&local_198,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x247);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                           0x2f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_178._M_dataplus._M_p,
                                     local_178._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,
                           "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                           ,0x66);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
                }
                else {
                  sVar13 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,__s,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," line ",6);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"",0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
                std::ostream::put((char)poVar12);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_198);
              }
              cVar14 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_138,&local_178);
              bVar6 = IsTrue((_Rb_tree_header *)cVar14._M_node ==
                             &local_138._M_impl.super__Rb_tree_header);
              if (!bVar6) {
                GTestLog::GTestLog((GTestLog *)&local_198,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x24d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_178._M_dataplus._M_p,
                                     local_178._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', in ",6);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
                }
                else {
                  sVar13 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,__s,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," line ",6);
                plVar15 = (long *)std::ostream::operator<<(poVar12,iVar8);
                std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
                std::ostream::put((char)plVar15);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_198);
              }
              peVar4 = (local_1a0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              if ((peVar4->test_base_name)._M_string_length != 0) {
                pcVar16 = (char *)std::__cxx11::string::_M_append
                                            ((char *)&local_100,
                                             (ulong)(peVar4->test_base_name)._M_dataplus._M_p);
                std::__cxx11::string::append(pcVar16);
              }
              std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_178._M_dataplus._M_p);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_138,&local_178);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,local_158,local_158 + local_150);
              pcVar16 = local_100;
              PrintToString<P256NistzSelectImpl>(&local_198,local_108);
              value_param._M_p = local_198._M_dataplus._M_p;
              peVar4 = (local_1a0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_b0.file._M_dataplus._M_p = (pointer)&local_b0.file.field_2;
              pcVar3 = (peVar4->code_location).file._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b0,pcVar3,
                         pcVar3 + (peVar4->code_location).file._M_string_length);
              local_b0.line = (peVar4->code_location).line;
              local_60 = lVar17;
              iVar7 = (*(this->super_ParameterizedTestSuiteInfoBase).
                        _vptr_ParameterizedTestSuiteInfoBase[3])(this);
              set_up_tc = SuiteApiResolver<P256NistzSelectImplTest>::GetSetUpCaseOrSuite(__s,iVar8);
              tear_down_tc = SuiteApiResolver<P256NistzSelectImplTest>::GetTearDownCaseOrSuite
                                       (__s,iVar8);
              factory = (TestFactoryBase *)
                        (**(code **)(*(long *)(((local_1a0->
                                                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr)->test_meta_factory)._M_t.
                                              super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<P256NistzSelectImpl>,_std::default_delete<testing::internal::TestMetaFactoryBase<P256NistzSelectImpl>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<P256NistzSelectImpl>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<P256NistzSelectImpl>_>_>
                                              .
                                              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<P256NistzSelectImpl>_*,_false>
                                    + 0x10))();
              MakeAndRegisterTestInfo
                        (&local_e0,pcVar16,(char *)0x0,value_param._M_p,&local_b0,
                         (TypeId)CONCAT44(extraout_var,iVar7),set_up_tc,tear_down_tc,factory);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0.file._M_dataplus._M_p != &local_b0.file.field_2) {
                operator_delete(local_b0.file._M_dataplus._M_p,
                                local_b0.file.field_2._M_allocated_capacity + 1);
              }
              this = local_70;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p,
                                (ulong)(local_198.field_2._M_allocated_capacity + 1));
              }
              lVar17 = local_60;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p != &local_178.field_2) {
                operator_delete(local_178._M_dataplus._M_p,
                                local_178.field_2._M_allocated_capacity + 1);
              }
              lVar17 = lVar17 + 1;
              bVar6 = true;
              (**(code **)(*plVar10 + 0x18))(plVar10);
            }
          }
          if (plVar11 != (long *)0x0) {
            (**(code **)(*plVar11 + 8))(plVar11);
          }
          if (plVar10 != (long *)0x0) {
            (**(code **)(*plVar10 + 8))(plVar10);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_138);
          if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
          }
          pIVar9 = local_78 + 1;
        } while (pIVar9 != local_80);
      }
      local_1a0 = local_1a0 + 1;
    } while (local_1a0 != local_88);
    if (bVar6) goto LAB_002ed870;
  }
  iVar8 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                    (this);
  paVar1 = &local_58.file.field_2;
  pcVar3 = (this->code_location_).file._M_dataplus._M_p;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + (this->code_location_).file._M_string_length);
  local_58.line = (this->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar8),&local_58,
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
LAB_002ed870:
  if (local_100 != &local_f0) {
    operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,CONCAT71(uStack_147,local_148) + 1);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }